

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void progress_meter(connectdata *conn)

{
  Curl_easy *pCVar1;
  FILE *whereto;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [12];
  long lVar7;
  timediff_t tVar8;
  long seconds;
  curltime *pcVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  int iVar18;
  bool bVar19;
  curltime cVar20;
  curltime older;
  curltime newer;
  curltime newer_00;
  long local_1d0;
  long local_1c0;
  curl_off_t local_1b8;
  long local_1a8;
  int local_190;
  int local_18c;
  long local_188;
  long local_178;
  long local_168;
  long local_158;
  curl_off_t total_estimate;
  curl_off_t dlestimate;
  curl_off_t ulestimate;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  curl_off_t total_expected_transfer;
  curl_off_t total_transfer;
  curl_off_t total_percen;
  curl_off_t ulpercen;
  curl_off_t dlpercen;
  char max5 [6] [10];
  curl_off_t amount;
  timediff_t span_ms;
  int checkindex;
  int nowindex;
  int countindex;
  undefined4 uStack_7c;
  curl_off_t ul;
  curl_off_t dl;
  _Bool shownow;
  Curl_easy *data;
  curl_off_t timespent_ms;
  curl_off_t timespent;
  curltime now;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  bVar19 = false;
  lVar10 = (pCVar1->progress).downloaded;
  lVar11 = (pCVar1->progress).uploaded;
  cVar20 = Curl_now();
  lVar7 = cVar20.tv_sec;
  auVar6 = cVar20._0_12_;
  uVar2 = (pCVar1->progress).start.tv_sec;
  uVar3 = (pCVar1->progress).start.tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  older._12_4_ = 0;
  newer._12_4_ = 0;
  newer.tv_sec = auVar6._0_8_;
  newer.tv_usec = auVar6._8_4_;
  tVar8 = Curl_timediff_us(newer,older);
  (pCVar1->progress).timespent = tVar8;
  seconds = (pCVar1->progress).timespent / 1000000;
  local_178 = (pCVar1->progress).timespent / 1000;
  if (lVar10 < 0x20c49ba5e353f7) {
    local_158 = local_178;
    if (local_178 < 1) {
      local_158 = 1;
    }
    (pCVar1->progress).dlspeed = (lVar10 * 1000) / local_158;
  }
  else {
    local_168 = seconds;
    if (seconds < 1) {
      local_168 = 1;
    }
    (pCVar1->progress).dlspeed = lVar10 / local_168;
  }
  if (lVar11 < 0x20c49ba5e353f7) {
    if (local_178 < 1) {
      local_178 = 1;
    }
    (pCVar1->progress).ulspeed = (lVar11 * 1000) / local_178;
  }
  else {
    local_188 = seconds;
    if (seconds < 1) {
      local_188 = 1;
    }
    (pCVar1->progress).ulspeed = lVar11 / local_188;
  }
  if ((pCVar1->progress).lastshow != lVar7) {
    iVar18 = (pCVar1->progress).speeder_c % 6;
    bVar19 = ((pCVar1->progress).flags & 0x10U) == 0;
    (pCVar1->progress).lastshow = lVar7;
    (pCVar1->progress).speeder[iVar18] = (pCVar1->progress).downloaded + (pCVar1->progress).uploaded
    ;
    pcVar9 = (pCVar1->progress).speeder_time + iVar18;
    pcVar9->tv_sec = lVar7;
    *(ulong *)&pcVar9->tv_usec = CONCAT44(uStack_7c,cVar20.tv_usec);
    (pCVar1->progress).speeder_c = (pCVar1->progress).speeder_c + 1;
    if ((pCVar1->progress).speeder_c < 6) {
      local_18c = (pCVar1->progress).speeder_c;
    }
    else {
      local_18c = 6;
    }
    if (local_18c == 1) {
      (pCVar1->progress).current_speed = (pCVar1->progress).ulspeed + (pCVar1->progress).dlspeed;
    }
    else {
      if ((pCVar1->progress).speeder_c < 6) {
        local_190 = 0;
      }
      else {
        local_190 = (pCVar1->progress).speeder_c % 6;
      }
      pcVar9 = (pCVar1->progress).speeder_time + local_190;
      uVar4 = pcVar9->tv_sec;
      uVar5 = pcVar9->tv_usec;
      cVar20.tv_usec = uVar5;
      cVar20.tv_sec = uVar4;
      cVar20._12_4_ = 0;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar6._0_8_;
      newer_00.tv_usec = auVar6._8_4_;
      amount = Curl_timediff(newer_00,cVar20);
      if (amount == 0) {
        amount = 1;
      }
      register0x00000000 =
           (pCVar1->progress).speeder[iVar18] - (pCVar1->progress).speeder[local_190];
      if (register0x00000000 < 0x418938) {
        (pCVar1->progress).current_speed = (register0x00000000 * 1000) / amount;
      }
      else {
        (pCVar1->progress).current_speed =
             (long)((double)register0x00000000 / ((double)amount / 1000.0));
      }
    }
  }
  if (bVar19) {
    ulpercen = 0;
    total_percen = 0;
    total_transfer = 0;
    dlestimate = 0;
    total_estimate = 0;
    if (((pCVar1->progress).flags & 0x80U) == 0) {
      if ((pCVar1->state).resume_from != 0) {
        curl_mfprintf((pCVar1->set).err,"** Resuming transfer from byte position %ld\n",
                      (pCVar1->state).resume_from);
      }
      curl_mfprintf((pCVar1->set).err,
                    "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                   );
      (pCVar1->progress).flags = (pCVar1->progress).flags | 0x80;
    }
    if ((((pCVar1->progress).flags & 0x20U) != 0) && (0 < (pCVar1->progress).ulspeed)) {
      dlestimate = (pCVar1->progress).size_ul / (pCVar1->progress).ulspeed;
      if ((pCVar1->progress).size_ul < 0x2711) {
        if (0 < (pCVar1->progress).size_ul) {
          total_percen = ((pCVar1->progress).uploaded * 100) / (pCVar1->progress).size_ul;
        }
      }
      else {
        total_percen = (pCVar1->progress).uploaded / ((pCVar1->progress).size_ul / 100);
      }
    }
    if ((((pCVar1->progress).flags & 0x40U) != 0) && (0 < (pCVar1->progress).dlspeed)) {
      total_estimate = (pCVar1->progress).size_dl / (pCVar1->progress).dlspeed;
      if ((pCVar1->progress).size_dl < 0x2711) {
        if (0 < (pCVar1->progress).size_dl) {
          ulpercen = ((pCVar1->progress).downloaded * 100) / (pCVar1->progress).size_dl;
        }
      }
      else {
        ulpercen = (pCVar1->progress).downloaded / ((pCVar1->progress).size_dl / 100);
      }
    }
    if (total_estimate < dlestimate) {
      local_1a8 = dlestimate;
    }
    else {
      local_1a8 = total_estimate;
    }
    if (local_1a8 < 1) {
      local_1b8 = 0;
    }
    else {
      local_1b8 = local_1a8 - seconds;
    }
    time2str(time_total + 2,local_1b8);
    time2str(time_spent + 2,local_1a8);
    time2str((char *)((long)&ulestimate + 2),seconds);
    if (((pCVar1->progress).flags & 0x20U) == 0) {
      local_1c0 = (pCVar1->progress).uploaded;
    }
    else {
      local_1c0 = (pCVar1->progress).size_ul;
    }
    if (((pCVar1->progress).flags & 0x40U) == 0) {
      local_1d0 = (pCVar1->progress).downloaded;
    }
    else {
      local_1d0 = (pCVar1->progress).size_dl;
    }
    lVar10 = local_1c0 + local_1d0;
    lVar11 = (pCVar1->progress).downloaded + (pCVar1->progress).uploaded;
    if (lVar10 < 0x2711) {
      if (0 < lVar10) {
        total_transfer = (lVar11 * 100) / lVar10;
      }
    }
    else {
      total_transfer = lVar11 / (lVar10 / 100);
    }
    whereto = (pCVar1->set).err;
    pcVar12 = max5data(lVar10,max5[1] + 2);
    pcVar13 = max5data((pCVar1->progress).downloaded,(char *)&dlpercen);
    pcVar14 = max5data((pCVar1->progress).uploaded,max5[0] + 2);
    pcVar15 = max5data((pCVar1->progress).dlspeed,max5[2] + 2);
    pcVar16 = max5data((pCVar1->progress).ulspeed,max5[3] + 2);
    pcVar17 = max5data((pCVar1->progress).current_speed,max5[4] + 2);
    curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",total_transfer,pcVar12,
                  ulpercen,pcVar13,total_percen,pcVar14,pcVar15,pcVar16,time_spent + 2,
                  (long)&ulestimate + 2,time_total + 2,pcVar17);
    fflush((FILE *)(pCVar1->set).err);
  }
  return;
}

Assistant:

static void progress_meter(struct connectdata *conn)
{
  struct curltime now;
  curl_off_t timespent;
  curl_off_t timespent_ms; /* milliseconds */
  struct Curl_easy *data = conn->data;
  bool shownow = FALSE;
  curl_off_t dl = data->progress.downloaded;
  curl_off_t ul = data->progress.uploaded;

  now = Curl_now(); /* what time is it */

  /* The time spent so far (from the start) */
  data->progress.timespent = Curl_timediff_us(now, data->progress.start);
  timespent = (curl_off_t)data->progress.timespent/1000000; /* seconds */
  timespent_ms = (curl_off_t)data->progress.timespent/1000; /* ms */

  /* The average download speed this far */
  if(dl < CURL_OFF_T_MAX/1000)
    data->progress.dlspeed = (dl * 1000 / (timespent_ms>0?timespent_ms:1));
  else
    data->progress.dlspeed = (dl / (timespent>0?timespent:1));

  /* The average upload speed this far */
  if(ul < CURL_OFF_T_MAX/1000)
    data->progress.ulspeed = (ul * 1000 / (timespent_ms>0?timespent_ms:1));
  else
    data->progress.ulspeed = (ul / (timespent>0?timespent:1));

  /* Calculations done at most once a second, unless end is reached */
  if(data->progress.lastshow != now.tv_sec) {
    int countindex; /* amount of seconds stored in the speeder array */
    int nowindex = data->progress.speeder_c% CURR_TIME;
    if(!(data->progress.flags & PGRS_HIDE))
      shownow = TRUE;

    data->progress.lastshow = now.tv_sec;

    /* Let's do the "current speed" thing, with the dl + ul speeds
       combined. Store the speed at entry 'nowindex'. */
    data->progress.speeder[ nowindex ] =
      data->progress.downloaded + data->progress.uploaded;

    /* remember the exact time for this moment */
    data->progress.speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    data->progress.speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we've filled in three entries etc. */
    countindex = ((data->progress.speeder_c >= CURR_TIME)?
                  CURR_TIME:data->progress.speeder_c) - 1;

    /* first of all, we don't do this if there's no counted seconds yet */
    if(countindex) {
      int checkindex;
      timediff_t span_ms;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (data->progress.speeder_c >= CURR_TIME)?
        data->progress.speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_timediff(now,
                              data->progress.speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms = 1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      {
        curl_off_t amount = data->progress.speeder[nowindex]-
          data->progress.speeder[checkindex];

        if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
          /* the 'amount' value is bigger than would fit in 32 bits if
             multiplied with 1000, so we use the double math for this */
          data->progress.current_speed = (curl_off_t)
            ((double)amount/((double)span_ms/1000.0));
        else
          /* the 'amount' value is small enough to fit within 32 bits even
             when multiplied with 1000 */
          data->progress.current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
      }
    }
    else
      /* the first second we use the average */
      data->progress.current_speed =
        data->progress.ulspeed + data->progress.dlspeed;

  } /* Calculations end */
  if(!shownow)
    /* only show the internal progress meter once per second */
    return;
  else {
    /* If there's no external callback set, use internal code to show
       progress */
    /* progress meter has not been shut off */
    char max5[6][10];
    curl_off_t dlpercen = 0;
    curl_off_t ulpercen = 0;
    curl_off_t total_percen = 0;
    curl_off_t total_transfer;
    curl_off_t total_expected_transfer;
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    curl_off_t ulestimate = 0;
    curl_off_t dlestimate = 0;
    curl_off_t total_estimate;

    if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
      if(data->state.resume_from) {
        fprintf(data->set.err,
                "** Resuming transfer from byte position %"
                CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
      }
      fprintf(data->set.err,
              "  %% Total    %% Received %% Xferd  Average Speed   "
              "Time    Time     Time  Current\n"
              "                                 Dload  Upload   "
              "Total   Spent    Left  Speed\n");
      data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
    }

    /* Figure out the estimated time of arrival for the upload */
    if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
       (data->progress.ulspeed > CURL_OFF_T_C(0))) {
      ulestimate = data->progress.size_ul / data->progress.ulspeed;

      if(data->progress.size_ul > CURL_OFF_T_C(10000))
        ulpercen = data->progress.uploaded /
          (data->progress.size_ul/CURL_OFF_T_C(100));
      else if(data->progress.size_ul > CURL_OFF_T_C(0))
        ulpercen = (data->progress.uploaded*100) /
          data->progress.size_ul;
    }

    /* ... and the download */
    if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
       (data->progress.dlspeed > CURL_OFF_T_C(0))) {
      dlestimate = data->progress.size_dl / data->progress.dlspeed;

      if(data->progress.size_dl > CURL_OFF_T_C(10000))
        dlpercen = data->progress.downloaded /
          (data->progress.size_dl/CURL_OFF_T_C(100));
      else if(data->progress.size_dl > CURL_OFF_T_C(0))
        dlpercen = (data->progress.downloaded*100) /
          data->progress.size_dl;
    }

    /* Now figure out which of them is slower and use that one for the
       total estimate! */
    total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

    /* create the three time strings */
    time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
    time2str(time_total, total_estimate);
    time2str(time_spent, timespent);

    /* Get the total amount of data expected to get transferred */
    total_expected_transfer =
      ((data->progress.flags & PGRS_UL_SIZE_KNOWN)?
       data->progress.size_ul:data->progress.uploaded)+
      ((data->progress.flags & PGRS_DL_SIZE_KNOWN)?
       data->progress.size_dl:data->progress.downloaded);

    /* We have transferred this much so far */
    total_transfer = data->progress.downloaded + data->progress.uploaded;

    /* Get the percentage of data transferred so far */
    if(total_expected_transfer > CURL_OFF_T_C(10000))
      total_percen = total_transfer /
        (total_expected_transfer/CURL_OFF_T_C(100));
    else if(total_expected_transfer > CURL_OFF_T_C(0))
      total_percen = (total_transfer*100) / total_expected_transfer;

    fprintf(data->set.err,
            "\r"
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
            total_percen,  /* 3 letters */                /* total % */
            max5data(total_expected_transfer, max5[2]),   /* total size */
            dlpercen,      /* 3 letters */                /* rcvd % */
            max5data(data->progress.downloaded, max5[0]), /* rcvd size */
            ulpercen,      /* 3 letters */                /* xfer % */
            max5data(data->progress.uploaded, max5[1]),   /* xfer size */
            max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
            max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
            time_total,    /* 8 letters */                /* total time */
            time_spent,    /* 8 letters */                /* time spent */
            time_left,     /* 8 letters */                /* time left */
            max5data(data->progress.current_speed, max5[5])
      );

    /* we flush the output stream to make it appear as soon as possible */
    fflush(data->set.err);
  } /* don't show now */
}